

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O3

wchar_t header_old_tar(archive_read *a,tar *tar,archive_entry *entry,void *h)

{
  wchar_t wVar1;
  wchar_t wVar2;
  
  wVar1 = _archive_entry_copy_pathname_l(entry,(char *)h,100,tar->sconv);
  wVar2 = L'\0';
  if ((wVar1 != L'\0') &&
     (wVar2 = set_conversion_failed_error(a,tar->sconv,"Pathname"), wVar2 == L'\xffffffe2')) {
    return L'\xffffffe2';
  }
  wVar1 = header_common(a,tar,entry,h);
  if (wVar2 < wVar1) {
    wVar1 = wVar2;
  }
  tar->entry_padding = (ulong)(-(int)tar->entry_bytes_remaining & 0x1ff);
  return wVar1;
}

Assistant:

static int
header_old_tar(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, const void *h)
{
	const struct archive_entry_header_ustar	*header;
	int err = ARCHIVE_OK, err2;

	/* Copy filename over (to ensure null termination). */
	header = (const struct archive_entry_header_ustar *)h;
	if (archive_entry_copy_pathname_l(entry,
	    header->name, sizeof(header->name), tar->sconv) != 0) {
		err = set_conversion_failed_error(a, tar->sconv, "Pathname");
		if (err == ARCHIVE_FATAL)
			return (err);
	}

	/* Grab rest of common fields */
	err2 = header_common(a, tar, entry, h);
	if (err > err2)
		err = err2;

	tar->entry_padding = 0x1ff & (-tar->entry_bytes_remaining);
	return (err);
}